

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool __thiscall cmSetPropertyCommand::HandleCacheMode(cmSetPropertyCommand *this)

{
  bool bVar1;
  reference key;
  cmMakefile *this_00;
  cmake *this_01;
  cmState *this_02;
  char *pcVar2;
  ostream *poVar3;
  string local_6c0;
  ostringstream local_6a0 [8];
  ostringstream e_3;
  char *existingValue;
  cmake *cm;
  cmMakefile *mf;
  string *name;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  ostringstream local_4d0 [8];
  ostringstream e_2;
  string local_358;
  ostringstream local_338 [8];
  ostringstream e_1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream e;
  cmSetPropertyCommand *this_local;
  
  bVar1 = std::operator==(&this->PropertyName,"ADVANCED");
  if (bVar1) {
    if ((((this->Remove & 1U) == 0) && (bVar1 = cmSystemTools::IsOn(&this->PropertyValue), !bVar1))
       && (bVar1 = cmSystemTools::IsOff(&this->PropertyValue), !bVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      poVar3 = std::operator<<((ostream *)local_190,"given non-boolean value \"");
      poVar3 = std::operator<<(poVar3,(string *)&this->PropertyValue);
      std::operator<<(poVar3,"\" for CACHE property \"ADVANCED\".  ");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream(local_190);
      return false;
    }
  }
  else {
    bVar1 = std::operator==(&this->PropertyName,"TYPE");
    if (bVar1) {
      bVar1 = cmState::IsCacheEntryType(&this->PropertyValue);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(local_338);
        poVar3 = std::operator<<((ostream *)local_338,"given invalid CACHE entry TYPE \"");
        poVar3 = std::operator<<(poVar3,(string *)&this->PropertyValue);
        std::operator<<(poVar3,"\"");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::ostringstream::~ostringstream(local_338);
        return false;
      }
    }
    else {
      bVar1 = std::operator!=(&this->PropertyName,"HELPSTRING");
      if (((bVar1) && (bVar1 = std::operator!=(&this->PropertyName,"STRINGS"), bVar1)) &&
         (bVar1 = std::operator!=(&this->PropertyName,"VALUE"), bVar1)) {
        std::__cxx11::ostringstream::ostringstream(local_4d0);
        poVar3 = std::operator<<((ostream *)local_4d0,"given invalid CACHE property ");
        poVar3 = std::operator<<(poVar3,(string *)&this->PropertyName);
        poVar3 = std::operator<<(poVar3,".  ");
        poVar3 = std::operator<<(poVar3,"Settable CACHE properties are: ");
        std::operator<<(poVar3,"ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,(string *)&__range1);
        std::__cxx11::string::~string((string *)&__range1);
        std::__cxx11::ostringstream::~ostringstream(local_4d0);
        return false;
      }
    }
  }
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Names);
  name = (string *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Names);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&name);
    if (!bVar1) {
      return true;
    }
    key = std::
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator*(&__end1);
    this_00 = cmCommand::GetMakefile(&this->super_cmCommand);
    this_01 = cmMakefile::GetCMakeInstance(this_00);
    this_02 = cmake::GetState(this_01);
    pcVar2 = cmState::GetCacheEntryValue(this_02,key);
    if (pcVar2 == (char *)0x0) break;
    bVar1 = HandleCacheEntry(this,key);
    if (!bVar1) {
      return false;
    }
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::ostringstream::ostringstream(local_6a0);
  poVar3 = std::operator<<((ostream *)local_6a0,"could not find CACHE variable ");
  poVar3 = std::operator<<(poVar3,(string *)key);
  std::operator<<(poVar3,".  Perhaps it has not yet been created.");
  std::__cxx11::ostringstream::str();
  cmCommand::SetError(&this->super_cmCommand,&local_6c0);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::ostringstream::~ostringstream(local_6a0);
  return false;
}

Assistant:

bool cmSetPropertyCommand::HandleCacheMode()
{
  if (this->PropertyName == "ADVANCED") {
    if (!this->Remove && !cmSystemTools::IsOn(this->PropertyValue) &&
        !cmSystemTools::IsOff(this->PropertyValue)) {
      std::ostringstream e;
      e << "given non-boolean value \"" << this->PropertyValue
        << "\" for CACHE property \"ADVANCED\".  ";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName == "TYPE") {
    if (!cmState::IsCacheEntryType(this->PropertyValue)) {
      std::ostringstream e;
      e << "given invalid CACHE entry TYPE \"" << this->PropertyValue << "\"";
      this->SetError(e.str());
      return false;
    }
  } else if (this->PropertyName != "HELPSTRING" &&
             this->PropertyName != "STRINGS" &&
             this->PropertyName != "VALUE") {
    std::ostringstream e;
    e << "given invalid CACHE property " << this->PropertyName << ".  "
      << "Settable CACHE properties are: "
      << "ADVANCED, HELPSTRING, STRINGS, TYPE, and VALUE.";
    this->SetError(e.str());
    return false;
  }

  for (std::string const& name : this->Names) {
    // Get the source file.
    cmMakefile* mf = this->GetMakefile();
    cmake* cm = mf->GetCMakeInstance();
    const char* existingValue = cm->GetState()->GetCacheEntryValue(name);
    if (existingValue) {
      if (!this->HandleCacheEntry(name)) {
        return false;
      }
    } else {
      std::ostringstream e;
      e << "could not find CACHE variable " << name
        << ".  Perhaps it has not yet been created.";
      this->SetError(e.str());
      return false;
    }
  }
  return true;
}